

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

void hmm_init(hmm_context_t *ctx,hmm_t *hmm,int mpx,int ssid,int tmatid)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  
  hmm->ctx = ctx;
  hmm->mpx = (uint8)mpx;
  uVar1 = ctx->n_emit_state;
  bVar3 = (byte)uVar1;
  hmm->n_emit_state = bVar3;
  if (mpx == 0) {
    hmm->ssid = (uint16)ssid;
    memcpy(hmm->senid,ctx->sseq[ssid],(ulong)((uVar1 & 0xff) * 2));
    bVar3 = hmm->n_emit_state;
  }
  else {
    hmm->ssid = 0xffff;
    hmm->senid[0] = (uint16)ssid;
    if (1 < (uVar1 & 0xff)) {
      memset(hmm->senid + 1,0xff,(ulong)((uVar1 & 0xff) - 1) * 2);
    }
  }
  hmm->tmatid = (int16)tmatid;
  hmm->score[0] = -0x20000000;
  hmm->history[0] = -1;
  if (1 < bVar3) {
    lVar2 = 0;
    do {
      hmm->score[lVar2 + 1] = -0x20000000;
      hmm->history[lVar2 + 1] = -1;
      lVar2 = lVar2 + 1;
    } while ((ulong)bVar3 - 1 != lVar2);
  }
  hmm->out_score = -0x20000000;
  hmm->out_history = -1;
  hmm->bestscore = -0x20000000;
  hmm->frame = -1;
  return;
}

Assistant:

void
hmm_init(hmm_context_t *ctx, hmm_t *hmm, int mpx, int ssid, int tmatid)
{
    hmm->ctx = ctx;
    hmm->mpx = mpx;
    hmm->n_emit_state = ctx->n_emit_state;
    if (mpx) {
        int i;
        hmm->ssid = BAD_SSID;
        hmm->senid[0] = ssid;
        for (i = 1; i < hmm_n_emit_state(hmm); ++i) {
            hmm->senid[i] = BAD_SSID;
        }
    }
    else {
        hmm->ssid = ssid;
        memcpy(hmm->senid, ctx->sseq[ssid], hmm->n_emit_state * sizeof(*hmm->senid));
    }
    hmm->tmatid = tmatid;
    hmm_clear(hmm);
}